

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O0

void __thiscall wasm::InstrumentMemory::~InstrumentMemory(InstrumentMemory *this)

{
  InstrumentMemory *this_local;
  
  ~InstrumentMemory(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

bool addsEffects() override { return true; }